

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  ZSTD_matchState_t *pZVar2;
  undefined8 uVar3;
  seqStore_t *psVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int *piVar12;
  BYTE *pBVar13;
  int iVar14;
  int *ip;
  ulong uVar15;
  ulong uVar16;
  int *ip_00;
  BYTE *pBVar17;
  int *piVar18;
  long lVar19;
  seqDef *psVar20;
  int *piVar21;
  uint local_e0;
  uint local_dc;
  size_t ofbCandidate;
  ulong local_c8;
  seqStore_t *local_c0;
  ZSTD_matchState_t *local_b8;
  BYTE *local_b0;
  BYTE *local_a8;
  int *local_a0;
  uint *local_98;
  ulong local_90;
  BYTE *local_88;
  int *local_80;
  int local_78;
  int local_74;
  int local_70;
  uint local_6c;
  int *local_68;
  BYTE *local_60;
  BYTE *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  int *local_38;
  
  local_b0 = (ms->window).base;
  uVar7 = (ms->window).dictLimit;
  local_c8 = (ulong)uVar7;
  uVar5 = (ms->cParams).minMatch;
  uVar6 = 6;
  if (uVar5 < 6) {
    uVar6 = uVar5;
  }
  uVar5 = 4;
  if (4 < uVar6) {
    uVar5 = uVar6;
  }
  local_a8 = local_b0 + local_c8;
  local_e0 = *rep;
  pZVar2 = ms->dictMatchState;
  local_a0 = (int *)(pZVar2->window).nextSrc;
  local_88 = (pZVar2->window).base;
  local_58 = local_88 + (pZVar2->window).dictLimit;
  iVar14 = (int)local_a0;
  uVar6 = ((int)src - ((int)local_a8 + (int)local_58)) + iVar14;
  ip = (int *)((long)src + (ulong)(uVar6 == 0));
  local_c0 = seqStore;
  if (uVar6 < local_e0) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7977,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_dc = rep[1];
  if (uVar6 < local_dc) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7978,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iEnd = (int *)((long)src + srcSize);
  local_80 = (int *)((long)src + (srcSize - 8));
  ms->lazySkipping = 0;
  local_6c = ((int)local_88 - iVar14) + uVar7;
  local_60 = local_88 + -(ulong)local_6c;
  local_68 = iEnd + -8;
  iVar11 = (int)local_b0;
  local_70 = (1 - uVar7) - iVar11;
  local_78 = -iVar11;
  local_74 = (((iVar14 - uVar7) - (int)local_88) - iVar11) + 1;
  local_b8 = ms;
  do {
    while( true ) {
      pZVar2 = local_b8;
      if (local_80 <= ip) {
        *rep = local_e0;
        rep[1] = local_dc;
        return (long)iEnd - (long)src;
      }
      piVar21 = (int *)((long)ip + 1);
      iVar14 = (int)ip;
      uVar7 = ((iVar14 - (int)local_b0) - local_e0) + 1;
      piVar18 = (int *)(local_b0 + uVar7);
      if (uVar7 < (uint)local_c8) {
        piVar18 = (int *)(local_88 + (uVar7 - local_6c));
      }
      if ((uVar7 - (uint)local_c8 < 0xfffffffd) && (*piVar18 == *piVar21)) {
        piVar12 = iEnd;
        if (uVar7 < (uint)local_c8) {
          piVar12 = local_a0;
        }
        sVar8 = ZSTD_count_2segments
                          ((BYTE *)((long)ip + 5),(BYTE *)(piVar18 + 1),(BYTE *)iEnd,(BYTE *)piVar12
                           ,local_a8);
        uVar15 = sVar8 + 4;
      }
      else {
        uVar15 = 0;
      }
      ofbCandidate = 999999999;
      if (uVar5 == 6) {
        uVar9 = ZSTD_HcFindBestMatch_dictMatchState_6(pZVar2,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
      }
      else if (uVar5 == 5) {
        uVar9 = ZSTD_HcFindBestMatch_dictMatchState_5(pZVar2,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
      }
      else {
        uVar9 = ZSTD_HcFindBestMatch_dictMatchState_4(pZVar2,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
      }
      uVar10 = uVar15;
      if (uVar15 < uVar9) {
        uVar10 = uVar9;
      }
      if (3 < uVar10) break;
      uVar15 = (long)ip - (long)src;
      ip = (int *)((long)ip + (uVar15 >> 8) + 1);
      local_b8->lazySkipping = (uint)(0x7ff < uVar15);
    }
    uVar16 = 1;
    if (uVar15 < uVar9) {
      piVar21 = ip;
      uVar16 = ofbCandidate;
    }
    local_40 = (ulong)((local_70 - local_e0) + iVar14);
    local_48 = (ulong)((local_78 - local_e0) + iVar14);
    local_50 = (ulong)((local_74 - local_e0) + iVar14);
    piVar18 = ip;
    local_98 = rep;
    for (lVar19 = 0; uVar15 = uVar10, (int *)((long)ip + lVar19) < local_80; lVar19 = lVar19 + 1) {
      ip_00 = (int *)((long)ip + lVar19 + 1);
      iVar14 = (int)lVar19;
      uVar7 = (int)local_48 + iVar14 + 1;
      piVar12 = (int *)(local_b0 + uVar7);
      if (uVar7 < (uint)local_c8) {
        piVar12 = (int *)(local_88 + (uint)((int)local_50 + iVar14));
      }
      local_90 = uVar16;
      local_38 = piVar18;
      if (((uint)((int)local_40 + iVar14) < 0xfffffffd) && (*piVar12 == *ip_00)) {
        piVar18 = iEnd;
        if (uVar7 < (uint)local_c8) {
          piVar18 = local_a0;
        }
        sVar8 = ZSTD_count_2segments
                          ((BYTE *)((long)ip + lVar19 + 5),(BYTE *)(piVar12 + 1),(BYTE *)iEnd,
                           (BYTE *)piVar18,local_a8);
        if (sVar8 < 0xfffffffffffffffc) {
          uVar7 = 0x1f;
          if ((uint)local_90 != 0) {
            for (; (uint)local_90 >> uVar7 == 0; uVar7 = uVar7 - 1) {
            }
          }
          if ((int)((uVar7 ^ 0x1f) + (int)uVar10 * 3 + -0x1e) < (int)(sVar8 + 4) * 3) {
            local_90 = 1;
            uVar15 = sVar8 + 4;
            piVar21 = ip_00;
          }
        }
      }
      ofbCandidate = 999999999;
      if (uVar5 == 6) {
        uVar10 = ZSTD_HcFindBestMatch_dictMatchState_6
                           (local_b8,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
      }
      else if (uVar5 == 5) {
        uVar10 = ZSTD_HcFindBestMatch_dictMatchState_5
                           (local_b8,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
      }
      else {
        uVar10 = ZSTD_HcFindBestMatch_dictMatchState_4
                           (local_b8,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
      }
      uVar16 = local_90;
      if (uVar10 < 4) break;
      uVar7 = 0x1f;
      if ((uint)local_90 != 0) {
        for (; (uint)local_90 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      iVar14 = 0x1f;
      if ((uint)ofbCandidate != 0) {
        for (; (uint)ofbCandidate >> iVar14 == 0; iVar14 = iVar14 + -1) {
        }
      }
      if ((int)uVar10 * 4 - iVar14 <= (int)((uVar7 ^ 0x1f) + (int)uVar15 * 4 + -0x1b)) break;
      piVar18 = (int *)((long)local_38 + 1);
      uVar16 = ofbCandidate;
      piVar21 = piVar18;
    }
    psVar4 = local_c0;
    if (3 < uVar16) {
      uVar9 = (long)piVar21 + (-(long)local_b0 - uVar16) + -0xfffffffd;
      pBVar13 = local_b0;
      pBVar17 = local_a8;
      if ((uint)uVar9 < (uint)local_c8) {
        pBVar13 = local_60;
        pBVar17 = local_58;
      }
      pBVar13 = pBVar13 + (uVar9 & 0xffffffff);
      for (; ((src < piVar21 && (pBVar17 < pBVar13)) &&
             (*(BYTE *)((long)piVar21 + -1) == pBVar13[-1])); piVar21 = (int *)((long)piVar21 + -1))
      {
        pBVar13 = pBVar13 + -1;
        uVar15 = uVar15 + 1;
      }
      local_dc = local_e0;
      local_e0 = (U32)uVar16 - 3;
    }
    if (local_c0->maxNbSeq <=
        (ulong)((long)local_c0->sequences - (long)local_c0->sequencesStart >> 3)) {
LAB_00186ba9:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < local_c0->maxNbLit) {
LAB_00186b8a:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar9 = (long)piVar21 - (long)src;
    pBVar17 = local_c0->lit;
    if (local_c0->litStart + local_c0->maxNbLit < pBVar17 + uVar9) {
LAB_00186b4c:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468e,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (iEnd < piVar21) {
LAB_00186b6b:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (local_68 < piVar21) {
      ZSTD_safecopyLiterals(pBVar17,(BYTE *)src,(BYTE *)piVar21,(BYTE *)local_68);
LAB_0018688a:
      psVar4->lit = psVar4->lit + uVar9;
      if (0xffff < uVar9) {
        if (psVar4->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        psVar4->longLengthType = ZSTD_llt_literalLength;
        psVar4->longLengthPos =
             (U32)((ulong)((long)psVar4->sequences - (long)psVar4->sequencesStart) >> 3);
      }
    }
    else {
      uVar3 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar17 = *src;
      *(undefined8 *)(pBVar17 + 8) = uVar3;
      pBVar17 = local_c0->lit;
      if (0x10 < uVar9) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar17 + 0x10 + (-0x10 - ((long)src + 0x10))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x36a6,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar3 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar17 + 0x18) = uVar3;
        if (0x20 < (long)uVar9) {
          lVar19 = 0;
          do {
            puVar1 = (undefined8 *)((long)src + lVar19 + 0x20);
            uVar3 = puVar1[1];
            pBVar13 = pBVar17 + lVar19 + 0x20;
            *(undefined8 *)pBVar13 = *puVar1;
            *(undefined8 *)(pBVar13 + 8) = uVar3;
            puVar1 = (undefined8 *)((long)src + lVar19 + 0x30);
            uVar3 = puVar1[1];
            *(undefined8 *)(pBVar13 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar13 + 0x18) = uVar3;
            lVar19 = lVar19 + 0x20;
          } while (pBVar13 + 0x20 < pBVar17 + uVar9);
        }
        goto LAB_0018688a;
      }
      local_c0->lit = pBVar17 + uVar9;
    }
    psVar20 = psVar4->sequences;
    psVar20->litLength = (U16)uVar9;
    psVar20->offBase = (U32)uVar16;
    if (uVar15 < 3) {
LAB_00186b2d:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x46aa,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < uVar15 - 3) {
      if (local_c0->longLengthType != ZSTD_llt_none) {
LAB_00186bc8:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46ad,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      local_c0->longLengthType = ZSTD_llt_matchLength;
      local_c0->longLengthPos = (U32)((ulong)((long)psVar20 - (long)local_c0->sequencesStart) >> 3);
    }
    psVar20->mlBase = (U16)(uVar15 - 3);
    psVar20 = psVar20 + 1;
    local_c0->sequences = psVar20;
    if (local_b8->lazySkipping != 0) {
      local_b8->lazySkipping = 0;
    }
    uVar7 = local_dc;
    for (ip = (int *)((long)piVar21 + uVar15); local_dc = uVar7, src = ip, rep = local_98,
        ip <= local_80; ip = (int *)((long)ip + sVar8 + 4)) {
      uVar7 = ((int)ip - (int)local_b0) - local_dc;
      pBVar17 = local_b0;
      if (uVar7 < (uint)local_c8) {
        pBVar17 = local_60;
      }
      if ((0xfffffffc < uVar7 - (uint)local_c8) || (*(int *)(pBVar17 + uVar7) != *ip)) break;
      piVar21 = iEnd;
      if (uVar7 < (uint)local_c8) {
        piVar21 = local_a0;
      }
      sVar8 = ZSTD_count_2segments
                        ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar17 + uVar7) + 4),(BYTE *)iEnd,
                         (BYTE *)piVar21,local_a8);
      psVar4 = local_c0;
      if (local_c0->maxNbSeq <= (ulong)((long)psVar20 - (long)local_c0->sequencesStart >> 3))
      goto LAB_00186ba9;
      if (0x20000 < local_c0->maxNbLit) goto LAB_00186b8a;
      pBVar17 = local_c0->lit;
      if (local_c0->litStart + local_c0->maxNbLit < pBVar17) goto LAB_00186b4c;
      if (iEnd < ip) goto LAB_00186b6b;
      if (local_68 < ip) {
        ZSTD_safecopyLiterals(pBVar17,(BYTE *)ip,(BYTE *)ip,(BYTE *)local_68);
      }
      else {
        uVar3 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar17 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar17 + 8) = uVar3;
      }
      psVar20 = psVar4->sequences;
      psVar20->litLength = 0;
      psVar20->offBase = 1;
      if (sVar8 + 4 < 3) goto LAB_00186b2d;
      if (0xffff < sVar8 + 1) {
        if (local_c0->longLengthType != ZSTD_llt_none) goto LAB_00186bc8;
        local_c0->longLengthType = ZSTD_llt_matchLength;
        local_c0->longLengthPos =
             (U32)((ulong)((long)psVar20 - (long)local_c0->sequencesStart) >> 3);
      }
      psVar20->mlBase = (U16)(sVar8 + 1);
      psVar20 = psVar20 + 1;
      local_c0->sequences = psVar20;
      uVar7 = local_e0;
      local_e0 = local_dc;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1, ZSTD_dictMatchState);
}